

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimal1.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  FourCC FVar1;
  uint32_t uVar2;
  ostream *poVar3;
  Chunk ch;
  vector<char,_std::allocator<char>_> buffer;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> chunks;
  Chunk local_50;
  vector<char,_std::allocator<char>_> local_48;
  Chunk local_30;
  Chunk local_28;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> local_20;
  
  riffcpp::Chunk::Chunk(&local_50,"minimal.riff");
  FVar1 = riffcpp::Chunk::id(&local_50);
  if (FVar1._M_elems == (_Type)0x46464952) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ch.id() == riffcpp::riff_id (",0x1d);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
    FVar1 = riffcpp::Chunk::type(&local_50);
    if (FVar1._M_elems == (_Type)0x6c706d73) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ch.type() == smpl_id (",0x16);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
      riffcpp::Chunk::begin(&local_28,SUB81(&local_50,0));
      riffcpp::Chunk::end(&local_30);
      std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
      vector<riffcpp::Chunk::iterator,void>
                ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)&local_20,
                 (iterator *)&local_28,(iterator *)&local_30,(allocator_type *)&local_48);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_30);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_28);
      if ((long)local_20.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)local_20.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl
                .super__Vector_impl_data._M_start == 8) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"chunks.size() == 1 (",0x14);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
        FVar1 = riffcpp::Chunk::id(local_20.
                                   super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (FVar1._M_elems == (_Type)0x74736574) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"chunks[0].id() == test_id (",0x1b);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
          local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (char *)0x0;
          local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          uVar2 = riffcpp::Chunk::size
                            (local_20.
                             super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          std::vector<char,_std::allocator<char>_>::resize(&local_48,(ulong)uVar2);
          riffcpp::Chunk::read_data
                    (local_20.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
          if ((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"buffer.size() == 1 (",0x14);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xd);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
            if (*local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start == -1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"(unsigned char)buffer[0] == 0xFF (",0x22);
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
              if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != (char *)0x0) {
                operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_48.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::~vector(&local_20);
              riffcpp::Chunk::~Chunk(&local_50);
              return 0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,": (unsigned char)buffer[0] == 0xFF\n",0x23);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,"Subchunk must contain \'0xFF\'",0x1c);
            std::operator<<(poVar3,'\n');
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,": buffer.size() == 1\n",0x15)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,"Subchunk must have data size 1",0x1e);
            std::operator<<(poVar3,'\n');
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,": chunks[0].id() == test_id\n",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"Subchunk must have \'test\' id",0x1c);
          std::operator<<(poVar3,'\n');
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": chunks.size() == 1\n",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Toplevel chunk must contain one subchunk",0x28);
        std::operator<<(poVar3,'\n');
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ch.type() == smpl_id\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Expected \'smpl\' chunk",0x15);
      std::operator<<(poVar3,'\n');
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,": ch.id() == riffcpp::riff_id\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Toplevel \'RIFF\' id expected",0x1b);
    std::operator<<(poVar3,'\n');
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  riffcpp::Chunk ch("minimal.riff");
  TEST_ASSERT(ch.id() == riffcpp::riff_id, "Toplevel 'RIFF' id expected");
  TEST_ASSERT(ch.type() == smpl_id, "Expected 'smpl' chunk");
  std::vector<riffcpp::Chunk> chunks(ch.begin(), ch.end());
  TEST_ASSERT(chunks.size() == 1, "Toplevel chunk must contain one subchunk");
  TEST_ASSERT(chunks[0].id() == test_id, "Subchunk must have 'test' id");
  std::vector<char> buffer;
  buffer.resize(chunks[0].size());
  chunks[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(buffer.size() == 1, "Subchunk must have data size 1");
  TEST_ASSERT((unsigned char)buffer[0] == 0xFF, "Subchunk must contain '0xFF'");
}